

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

void __thiscall Matrix::operator=(Matrix *this,double d)

{
  int iVar1;
  double *pdVar2;
  int i;
  long lVar3;
  
  iVar1 = this->nData;
  pdVar2 = this->pData;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    pdVar2[lVar3] = d;
  }
  return;
}

Assistant:

void Matrix::operator=(double d)
{
    for(int i=0; i<nData; i++)
        pData[i] = d;
}